

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

int __thiscall
kj::anon_unknown_59::InMemoryDirectory::stat(InMemoryDirectory *this,char *__file,stat *__buf)

{
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl> lock;
  
  MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl>::lockShared
            ((MutexGuarded<kj::(anonymous_namespace)::InMemoryDirectory::Impl> *)&lock,__file + 0x18
            );
  *(undefined4 *)&(this->super_Directory).super_ReadableDirectory.super_FsNode._vptr_FsNode = 1;
  (this->super_AtomicRefcounted).super_Disposer._vptr_Disposer = (_func_int **)0x0;
  *(undefined8 *)&(this->super_AtomicRefcounted).refcount = 0;
  *(long *)&(this->impl).mutex = ((lock.ptr)->lastModified).value.value;
  *(undefined4 *)&(this->impl).mutex.waitersHead.ptr = 1;
  (this->impl).mutex.waitersTail = (Maybe<kj::_::Mutex::Waiter_&> *)__file;
  Locked<const_kj::(anonymous_namespace)::InMemoryDirectory::Impl>::~Locked(&lock);
  return (int)this;
}

Assistant:

Metadata stat() const override {
    auto lock = impl.lockShared();
    uint64_t hash = reinterpret_cast<uintptr_t>(this);
    return Metadata { Type::DIRECTORY, 0, 0, lock->lastModified, 1, hash };
  }